

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_message.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::objectivec::MessageGenerator::IncludesOneOfDefinition
          (MessageGenerator *this)

{
  bool bVar1;
  reference ppMVar2;
  __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_*const_*,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
  local_28;
  __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_*const_*,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
  local_20;
  const_iterator iter;
  MessageGenerator *this_local;
  
  iter._M_current = (MessageGenerator **)this;
  bVar1 = std::
          vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
          ::empty(&this->oneof_generators_);
  if (bVar1) {
    local_20._M_current =
         (MessageGenerator **)
         std::
         vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
         ::begin(&this->nested_message_generators_);
    while( true ) {
      local_28._M_current =
           (MessageGenerator **)
           std::
           vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
           ::end(&this->nested_message_generators_);
      bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
      if (!bVar1) break;
      ppMVar2 = __gnu_cxx::
                __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_*const_*,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
                ::operator*(&local_20);
      bVar1 = IncludesOneOfDefinition(*ppMVar2);
      if (bVar1) {
        return true;
      }
      __gnu_cxx::
      __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_*const_*,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
      ::operator++(&local_20);
    }
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool MessageGenerator::IncludesOneOfDefinition() const {
  if (!oneof_generators_.empty()) {
    return true;
  }

  for (vector<MessageGenerator*>::const_iterator iter =
           nested_message_generators_.begin();
       iter != nested_message_generators_.end(); ++iter) {
    if ((*iter)->IncludesOneOfDefinition()) {
      return true;
    }
  }

  return false;
}